

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5IndexReinit(Fts5Index *p)

{
  int iVar1;
  long in_FS_OFFSET;
  Fts5Structure local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  fts5StructureInvalidate(p);
  fts5IndexDiscardData(p);
  local_48.aLevel[0].nMerge = 0;
  local_48.aLevel[0].nSeg = 0;
  local_48.aLevel[0].aSeg = (Fts5StructureSegment *)0x0;
  local_48.nSegment = 0;
  local_48.nLevel = 0;
  local_48.nRef = 0;
  local_48._4_4_ = 0;
  local_48.nWriteCounter = 0;
  local_48.nOriginCntr = (u64)(p->pConfig->bContentlessDelete != 0);
  fts5DataWrite(p,1,"",0);
  fts5StructureWrite(p,&local_48);
  iVar1 = p->rc;
  p->rc = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5IndexReinit(Fts5Index *p){
  Fts5Structure s;
  fts5StructureInvalidate(p);
  fts5IndexDiscardData(p);
  memset(&s, 0, sizeof(Fts5Structure));
  if( p->pConfig->bContentlessDelete ){
    s.nOriginCntr = 1;
  }
  fts5DataWrite(p, FTS5_AVERAGES_ROWID, (const u8*)"", 0);
  fts5StructureWrite(p, &s);
  return fts5IndexReturn(p);
}